

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

bool __thiscall google::protobuf::EnumValueOptions::IsInitialized(EnumValueOptions *this)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  
  if (0 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar3 = 0;
    do {
      cVar1 = (**(code **)(*(this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_
                            [lVar3] + 0x28))();
      if (cVar1 == '\0') {
        return false;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  bVar2 = internal::ExtensionSet::IsInitialized(&this->_extensions_);
  return bVar2;
}

Assistant:

bool EnumValueOptions::IsInitialized() const {

  for (int i = 0; i < uninterpreted_option_size(); i++) {
    if (!this->uninterpreted_option(i).IsInitialized()) return false;
  }

  if (!_extensions_.IsInitialized()) return false;  return true;
}